

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGetProcAddressTests.cpp
# Opt level: O2

int __thiscall deqp::egl::GetProcAddressTests::init(GetProcAddressTests *this,EVP_PKEY_CTX *ctx)

{
  EglTestContext *eglTestCtx;
  _Alloc_hider name;
  char cVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  GetProcAddressExtensionCase *this_00;
  long lVar3;
  GetProcAddressCoreFunctionsCase *pGVar4;
  size_t ndx;
  ulong uVar5;
  string testName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"extension",
             "Test EGL extensions");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  for (lVar3 = 0; lVar3 != 0x9d; lVar3 = lVar3 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,(&egl::(anonymous_namespace)::s_extensions)[lVar3 * 3],
               (allocator<char> *)&testName);
    std::__cxx11::string::string((string *)&testName,(string *)&local_50);
    for (uVar5 = 0; uVar5 < local_50._M_string_length; uVar5 = uVar5 + 1) {
      cVar1 = de::toLower(local_50._M_dataplus._M_p[uVar5]);
      testName._M_dataplus._M_p[uVar5] = cVar1;
    }
    this_00 = (GetProcAddressExtensionCase *)operator_new(0xd0);
    name = testName._M_dataplus;
    eglTestCtx = (this->super_TestCaseGroup).m_eglTestCtx;
    std::operator+(&local_70,"Test ",&local_50);
    GetProcAddressExtensionCase::GetProcAddressExtensionCase
              (this_00,eglTestCtx,name._M_p,local_70._M_dataplus._M_p,&local_50);
    tcu::TestNode::addChild(pTVar2,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&testName);
    std::__cxx11::string::~string((string *)&local_50);
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"core",
             "Test core functions");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pGVar4 = (GetProcAddressCoreFunctionsCase *)operator_new(0xb8);
  GetProcAddressCoreFunctionsCase::GetProcAddressCoreFunctionsCase
            (pGVar4,(this->super_TestCaseGroup).m_eglTestCtx,"egl","Test EGL core functions",0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pGVar4);
  pGVar4 = (GetProcAddressCoreFunctionsCase *)operator_new(0xb8);
  GetProcAddressCoreFunctionsCase::GetProcAddressCoreFunctionsCase
            (pGVar4,(this->super_TestCaseGroup).m_eglTestCtx,"gles","Test OpenGL ES core functions",
             1);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pGVar4);
  pGVar4 = (GetProcAddressCoreFunctionsCase *)operator_new(0xb8);
  GetProcAddressCoreFunctionsCase::GetProcAddressCoreFunctionsCase
            (pGVar4,(this->super_TestCaseGroup).m_eglTestCtx,"gles2",
             "Test OpenGL ES 2 core functions",4);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pGVar4);
  pGVar4 = (GetProcAddressCoreFunctionsCase *)operator_new(0xb8);
  GetProcAddressCoreFunctionsCase::GetProcAddressCoreFunctionsCase
            (pGVar4,(this->super_TestCaseGroup).m_eglTestCtx,"gles3",
             "Test OpenGL ES 3 core functions",0x40);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pGVar4);
  return extraout_EAX;
}

Assistant:

void GetProcAddressTests::init (void)
{
	// extensions
	{
		tcu::TestCaseGroup* extensionsGroup = new tcu::TestCaseGroup(m_testCtx, "extension", "Test EGL extensions");
		addChild(extensionsGroup);

		for (int extNdx = 0; extNdx < DE_LENGTH_OF_ARRAY(s_extensions); extNdx++)
		{
			const std::string&		extName		= s_extensions[extNdx].name;
			std::string				testName	(extName);

			for (size_t ndx = 0; ndx < extName.length(); ndx++)
				testName[ndx] = de::toLower(extName[ndx]);

			extensionsGroup->addChild(new GetProcAddressExtensionCase(m_eglTestCtx, testName.c_str(), ("Test " + extName).c_str(), extName));
		}
	}

	// core functions
	{
		tcu::TestCaseGroup* coreFuncGroup = new tcu::TestCaseGroup(m_testCtx, "core", "Test core functions");
		addChild(coreFuncGroup);

		coreFuncGroup->addChild(new GetProcAddressCoreFunctionsCase	(m_eglTestCtx,	"egl",		"Test EGL core functions",			0));
		coreFuncGroup->addChild(new GetProcAddressCoreFunctionsCase	(m_eglTestCtx,	"gles",		"Test OpenGL ES core functions",	EGL_OPENGL_ES_BIT));
		coreFuncGroup->addChild(new GetProcAddressCoreFunctionsCase	(m_eglTestCtx,	"gles2",	"Test OpenGL ES 2 core functions",	EGL_OPENGL_ES2_BIT));
		coreFuncGroup->addChild(new GetProcAddressCoreFunctionsCase	(m_eglTestCtx,	"gles3",	"Test OpenGL ES 3 core functions",	EGL_OPENGL_ES3_BIT_KHR));
	}
}